

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CStructure::CopyLabel(CStructure *this,char *nnaam,aint offset)

{
  CStructureEntry1 *this_00;
  CStructureEntry1 *n;
  aint offset_local;
  char *nnaam_local;
  CStructure *this_local;
  
  this_00 = (CStructureEntry1 *)operator_new(0x18);
  CStructureEntry1::CStructureEntry1(this_00,nnaam,this->noffset + offset);
  if (this->mnf == (CStructureEntry1 *)0x0) {
    this->mnf = this_00;
  }
  else {
    this->mnl->next = this_00;
  }
  this->mnl = this_00;
  return;
}

Assistant:

void CStructure::CopyLabel(char* nnaam, aint offset) {
	CStructureEntry1* n = new CStructureEntry1(nnaam, noffset + offset);
	if (!mnf)	mnf = n;
	else		mnl->next = n;
	mnl = n;
}